

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

int av1_get_switchable_rate
              (MACROBLOCK *x,MACROBLOCKD *xd,InterpFilter interp_filter,int dual_filter)

{
  uint uVar1;
  MB_MODE_INFO *pMVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  int iVar5;
  int dir;
  int dir_00;
  
  iVar5 = 0;
  if ((int)CONCAT71(in_register_00000011,interp_filter) == 4) {
    pMVar2 = *xd->mi;
    iVar5 = 0;
    dir_00 = 0;
    do {
      if (dual_filter == 0 && dir_00 != 0) {
        return iVar5;
      }
      iVar4 = av1_get_pred_context_switchable_interp(xd,dir_00);
      uVar1 = (pMVar2->interp_filters).as_int;
      uVar3 = uVar1 >> 0x10;
      if (dir_00 == 0) {
        uVar3 = uVar1;
      }
      iVar5 = iVar5 + (x->mode_costs).switchable_interp_costs[iVar4][(ulong)uVar3 & 0xff];
      dir_00 = dir_00 + 1;
    } while (dir_00 == 1);
  }
  return iVar5;
}

Assistant:

int av1_get_switchable_rate(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            InterpFilter interp_filter, int dual_filter) {
  if (interp_filter == SWITCHABLE) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    int inter_filter_cost = 0;
    for (int dir = 0; dir < 2; ++dir) {
      if (dir && !dual_filter) break;
      const int ctx = av1_get_pred_context_switchable_interp(xd, dir);
      const InterpFilter filter =
          av1_extract_interp_filter(mbmi->interp_filters, dir);
      inter_filter_cost += x->mode_costs.switchable_interp_costs[ctx][filter];
    }
    return SWITCHABLE_INTERP_RATE_FACTOR * inter_filter_cost;
  } else {
    return 0;
  }
}